

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestOutput.cpp
# Opt level: O2

void __thiscall TestOutput::printFileAndLineForFailure(TestOutput *this,TestFailure *failure)

{
  int iVar1;
  undefined4 extraout_var;
  SimpleString SStack_38;
  SimpleString local_28;
  
  (*failure->_vptr_TestFailure[2])(&SStack_38);
  iVar1 = (*failure->_vptr_TestFailure[5])(failure);
  printErrorInFileOnLineFormattedForWorkingEnvironment(this,&SStack_38,CONCAT44(extraout_var,iVar1))
  ;
  SimpleString::~SimpleString(&SStack_38);
  (*failure->_vptr_TestFailure[3])(&local_28,failure);
  printFailureInTest(this,&local_28);
  SimpleString::~SimpleString(&local_28);
  return;
}

Assistant:

void TestOutput::printFileAndLineForFailure(const TestFailure& failure)
{
    printErrorInFileOnLineFormattedForWorkingEnvironment(failure.getFileName(), failure.getFailureLineNumber());
    printFailureInTest(failure.getTestName());
}